

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cone.cpp
# Opt level: O3

Tuple4d * __thiscall
geometry::primitive::Cone::local_normal
          (Tuple4d *__return_storage_ptr__,Cone *this,Tuple4d *point,Intersection *hit)

{
  byte bVar1;
  double *pdVar2;
  double x;
  double dVar3;
  double z;
  
  pdVar2 = math::Tuple4d::operator()(point,0);
  dVar3 = *pdVar2;
  pdVar2 = math::Tuple4d::operator()(point,2);
  dVar3 = *pdVar2 * *pdVar2 + dVar3 * dVar3;
  bVar1 = this->m_closed;
  if (((bool)bVar1 != true) || (ABS(this->m_minmax[1]) <= dVar3 + 1e-05)) {
LAB_00106cee:
    if (((bVar1 & 1) != 0) && (dVar3 + 1e-05 < ABS(this->m_minmax[0]))) {
      pdVar2 = math::Tuple4d::operator()(point,1);
      if (*pdVar2 <= this->m_minmax[0] + 1e-05) {
        dVar3 = -1.0;
        goto LAB_00106de3;
      }
    }
    pdVar2 = math::Tuple4d::operator()(point,1);
    dVar3 = *(double *)
             (&DAT_0010f4d0 +
             (ulong)(-(uint)((double)(-(ulong)(0.0 < *pdVar2) & 0x3ff0000000000000) * SQRT(dVar3) !=
                            0.0) & 1) * 8);
    pdVar2 = math::Tuple4d::operator()(point,0);
    x = *pdVar2;
    pdVar2 = math::Tuple4d::operator()(point,2);
    z = *pdVar2;
  }
  else {
    pdVar2 = math::Tuple4d::operator()(point,1);
    if (*pdVar2 < this->m_minmax[1] + -1e-05) {
      bVar1 = this->m_closed;
      goto LAB_00106cee;
    }
    dVar3 = 1.0;
LAB_00106de3:
    x = 0.0;
    z = 0.0;
  }
  math::vector(x,dVar3,z);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cone::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double distance = pow(point(0), 2) + pow(point(2), 2);
    if (m_closed &&
	distance + constants::EPSILON < std::abs(m_minmax[1]) &&
	point(1) >= m_minmax[1] - constants::EPSILON)
	return math::vector(0, 1, 0);
    else if (m_closed &&
	     distance + constants::EPSILON < std::abs(m_minmax[0]) &&
	     point(1) <= m_minmax[0] + constants::EPSILON)
	return math::vector(0, -1, 0);

    double y = sqrt(distance) * (point(1) > 0) ? -1 : 1;
    return math::vector(point(0), y, point(2));
}